

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O3

int arm_debug_target_el(CPUARMState_conflict *env)

{
  ulong uVar1;
  bool bVar2;
  
  uVar1 = env->features;
  if ((uVar1 >> 0x21 & 1) == 0) {
    bVar2 = false;
  }
  else {
    if (env->aarch64 == 0) {
      bVar2 = true;
      if ((env->uncached_cpsr & 0x1f) == 0x16) goto LAB_00629eb6;
    }
    else {
      bVar2 = true;
      if ((~env->pstate & 0xc) == 0) goto LAB_00629eb6;
    }
    bVar2 = ((env->cp15).scr_el3 & 1) == 0;
  }
  if ((uVar1 >> 0x20 & 1) != 0 && !bVar2) {
    if (((env->cp15).hcr_el2 & 0x8000000) != 0) {
      return 2;
    }
    if (((env->cp15).mdcr_el2 & 0x100) != 0) {
      return 2;
    }
  }
  if ((uVar1 >> 0x21 & 1) == 0) {
    return 1;
  }
LAB_00629eb6:
  if ((((uint)uVar1 >> 0x1c & 1) == 0) && (bVar2)) {
    return 3;
  }
  return 1;
}

Assistant:

static inline int arm_debug_target_el(CPUARMState *env)
{
    bool secure = arm_is_secure(env);
    bool route_to_el2 = false;

    if (arm_feature(env, ARM_FEATURE_EL2) && !secure) {
        route_to_el2 = env->cp15.hcr_el2 & HCR_TGE ||
                       env->cp15.mdcr_el2 & MDCR_TDE;
    }

    if (route_to_el2) {
        return 2;
    } else if (arm_feature(env, ARM_FEATURE_EL3) &&
               !arm_el_is_aa64(env, 3) && secure) {
        return 3;
    } else {
        return 1;
    }
}